

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setCmdOptionsAndRun(Carver *carver,int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int in_ESI;
  Carver *in_RDI;
  string filename;
  bool verbose;
  invalid_argument *anon_var_0;
  char *carveAmountOpt;
  float carveAmount;
  char *carveCountOpt;
  int carveCount;
  string outputStr;
  char *outputOpt;
  string carveModeStr;
  char *carveModeOpt;
  CarveMode carveMode;
  int optionCount;
  string *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  int iVar4;
  undefined8 in_stack_fffffffffffffb18;
  float carveAmount_00;
  Carver *in_stack_fffffffffffffb20;
  allocator<char> *in_stack_fffffffffffffb30;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb50;
  undefined1 required;
  string *in_stack_fffffffffffffb58;
  char **in_stack_fffffffffffffb60;
  char **in_stack_fffffffffffffb68;
  string *outputPath;
  Carver *in_stack_fffffffffffffbe0;
  string *filepath;
  Carver *this;
  string local_390 [72];
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9 [40];
  allocator<char> local_2d1;
  string local_2d0 [38];
  byte local_2aa;
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  char *local_1e0;
  float local_1d8;
  allocator<char> local_1a9;
  string local_1a8 [32];
  char *local_188;
  int local_180;
  undefined1 local_179 [80];
  allocator<char> local_129;
  string local_128 [32];
  char *local_108;
  allocator<char> local_d1;
  string local_d0 [79];
  allocator<char> local_81;
  string local_80 [32];
  char *local_60;
  CarveMode local_58;
  undefined1 local_41 [37];
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int local_c;
  Carver *local_8;
  
  carveAmount_00 = (float)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  required = (undefined1)((ulong)in_stack_fffffffffffffb50 >> 0x38);
  local_1c = 0;
  filepath = (string *)(&in_RDX->_M_dataplus + (long)in_ESI * 8);
  this = (Carver *)local_41;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,
             (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             in_stack_fffffffffffffb30);
  bVar1 = cmdOptionExists((char **)in_stack_fffffffffffffb00,(char **)in_stack_fffffffffffffaf8,
                          (string *)0x1226fd);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  if (bVar1) {
    usage();
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,
             (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             in_stack_fffffffffffffb30);
  pcVar3 = getCmdOption(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                        in_stack_fffffffffffffb58,(bool)required);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  local_60 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    std::allocator<char>::allocator();
    iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb40,
               (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30);
    terminate(iVar4,in_stack_fffffffffffffaf8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,
             (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             in_stack_fffffffffffffb30);
  std::allocator<char>::~allocator(&local_d1);
  local_1c = local_1c + 2;
  bVar1 = std::operator==(in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8);
  if (bVar1) {
    local_58 = BOTH;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8);
    if (bVar1) {
      local_58 = VERTICAL;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8);
      if (!bVar1) {
        std::allocator<char>::allocator();
        iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb40,
                   (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                   in_stack_fffffffffffffb30);
        terminate(iVar4,in_stack_fffffffffffffaf8);
      }
      local_58 = HORIZONTAL;
    }
  }
  ::carver::Carver::setCarveMode(local_8,local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,
             (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             in_stack_fffffffffffffb30);
  pcVar3 = getCmdOption(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                        in_stack_fffffffffffffb58,(bool)required);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_108 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    outputPath = (string *)local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb40,
               (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30);
    std::allocator<char>::~allocator((allocator<char> *)local_179);
    local_1c = local_1c + 2;
    local_180 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb40,
               (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30);
    pcVar3 = getCmdOption(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                          in_stack_fffffffffffffb58,(bool)required);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    local_188 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      local_180 = atoi(pcVar3);
      local_1c = local_1c + 2;
      if (local_180 == 0) {
        std::allocator<char>::allocator();
        iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb40,
                   (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                   in_stack_fffffffffffffb30);
        terminate(iVar4,in_stack_fffffffffffffaf8);
      }
    }
    local_1d8 = 0.0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb40,
               (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30);
    pcVar3 = getCmdOption(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                          in_stack_fffffffffffffb58,(bool)required);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
    local_1e0 = pcVar3;
    if ((pcVar3 == (char *)0x0) && (local_180 == 0)) {
      local_1d8 = 0.15;
    }
    else if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb40,
                 (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      local_1d8 = std::__cxx11::stof(in_stack_fffffffffffffb00,(size_t *)in_stack_fffffffffffffaf8);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
      local_1c = local_1c + 2;
      if ((local_1d8 == 0.0) && (!NAN(local_1d8))) {
        std::allocator<char>::allocator();
        iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb40,
                   (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                   in_stack_fffffffffffffb30);
        terminate(iVar4,in_stack_fffffffffffffaf8);
      }
    }
    if ((local_1e0 != (char *)0x0) && (local_188 != (char *)0x0)) {
      std::allocator<char>::allocator();
      iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb40,
                 (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      terminate(iVar4,in_stack_fffffffffffffaf8);
    }
    ::carver::Carver::setCarveAmount(in_stack_fffffffffffffb20,carveAmount_00);
    ::carver::Carver::setCarveCount(in_stack_fffffffffffffb20,(int)carveAmount_00);
    local_2aa = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_18,(char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30);
    bVar2 = cmdOptionExists((char **)in_stack_fffffffffffffb00,(char **)in_stack_fffffffffffffaf8,
                            (string *)0x1233b4);
    iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    if ((bVar2 & 1) != 0) {
      local_2aa = 1;
      local_1c = local_1c + 1;
    }
    ::carver::Carver::setVerbosity(local_8,(bool)(local_2aa & 1));
    if (local_1c + 2 <= local_c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_18,(char *)CONCAT17(bVar2,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::allocator<char>::~allocator(&local_321);
      std::__cxx11::string::string(local_348,local_320);
      bVar1 = ::carver::Carver::loadTargetImage(this,filepath);
      std::__cxx11::string::~string(local_348);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_18,(char *)CONCAT17(bVar2,in_stack_fffffffffffffb38),
                   in_stack_fffffffffffffb30);
        terminate(iVar4,in_stack_fffffffffffffaf8);
      }
      std::__cxx11::string::string(local_390,(string *)(local_179 + 1));
      ::carver::Carver::carveImage(in_stack_fffffffffffffbe0,outputPath);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string((string *)(local_179 + 1));
      std::__cxx11::string::~string(local_d0);
      return;
    }
    __a = local_2f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_18,(char *)CONCAT17(bVar2,in_stack_fffffffffffffb38),__a);
    terminate(iVar4,in_stack_fffffffffffffaf8);
  }
  std::allocator<char>::allocator();
  iVar4 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,
             (char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             in_stack_fffffffffffffb30);
  terminate(iVar4,in_stack_fffffffffffffaf8);
}

Assistant:

void setCmdOptionsAndRun(carver::Carver &carver, int argc, char *argv[]) {

    int optionCount = 0;

    // Request for help
    if (cmdOptionExists(argv, argv+argc, "-h")) {
            usage();
            exit(0);
    }

    // Carve mode
    carver::CarveMode carveMode;
    char* carveModeOpt = getCmdOption(argv, argv+argc, "-m", true);
    if (!carveModeOpt)
        terminate(1, "Carve mode value missing");
    string carveModeStr(carveModeOpt);
    optionCount+=2;
    if (carveModeStr == "both")
        carveMode = carver::BOTH;
    else if (carveModeStr == "vertical")
        carveMode = carver::VERTICAL;
    else if (carveModeStr == "horizontal")
        carveMode = carver::HORIZONTAL;
    else
        terminate(1, "Carve mode value invalid");

    carver.setCarveMode(carveMode);

    // Output path
    char* outputOpt = getCmdOption(argv, argv+argc, "-o", true);
    if (!outputOpt)
        terminate(1, "Output path missing");
    string outputStr(outputOpt);
    optionCount+=2;

    // Carve amount, absolute count
    int carveCount = 0;
    char* carveCountOpt = getCmdOption(argv, argv+argc, "-c", false);
    if (carveCountOpt) {
        carveCount = atoi(carveCountOpt);
        optionCount+=2;
        if (carveCount == 0) {
            terminate(1, "Invalid argument for carve count");
        }
    }

    // Carve amount, proportional
    float carveAmount = 0.0f;
    char* carveAmountOpt = getCmdOption(argv, argv+argc, "-p", false);
    if (!carveAmountOpt && !carveCount) {
        carveAmount = 0.15f;
    } else if (carveAmountOpt) {
        try {
            carveAmount = stof(string(carveAmountOpt));
            optionCount+=2;
            if (carveAmount == 0.0f) {
                terminate(1, "Invalid argument for carve amount");
            }
        } catch (invalid_argument&) {
            terminate(1, "Invalid argument for carve amount");
        }
    }

    if (carveAmountOpt && carveCountOpt)
        terminate(1, "Invalid combination of arguments -p and -c");

    carver.setCarveAmount(carveAmount);
    carver.setCarveCount(carveCount);


    // Verbosity
    bool verbose = false;
    if(cmdOptionExists(argv, argv+argc, "-v")) {
        verbose = true;
        optionCount++;
    }
    carver.setVerbosity(verbose);

    // Load target image
    if (argc < optionCount + 2)
        terminate(1, "input path not provided");
    string filename = argv[optionCount + 1];

    if(!carver.loadTargetImage(filename)) {
        terminate(1, "Image loading failed, please provide path as the last argument");
    }

    carver.carveImage(outputStr);
}